

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,true>
          (Thread *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Simd<short,_(unsigned_char)__b_> value;
  Simd<signed_char,_(unsigned_char)__x10_> SVar10;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  SVar10 = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  uVar1 = SVar10.v._0_8_;
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xe] = SVar10.v[7];
  auVar9[0xf] = SVar10.v[7];
  auVar8._14_2_ = auVar9._14_2_;
  auVar8._8_5_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xd] = SVar10.v[6];
  auVar7._13_3_ = auVar8._13_3_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xc] = SVar10.v[6];
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._8_3_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xb] = SVar10.v[5];
  auVar5._11_5_ = auVar6._11_5_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = SVar10.v[5];
  auVar4._10_6_ = auVar5._10_6_;
  auVar4[8] = 0;
  auVar4._0_8_ = uVar1;
  auVar4[9] = SVar10.v[4];
  auVar3._9_7_ = auVar4._9_7_;
  auVar3[8] = SVar10.v[4];
  auVar3._0_8_ = uVar1;
  auVar2._8_8_ = auVar3._8_8_;
  auVar2[7] = SVar10.v[3];
  auVar2[6] = SVar10.v[3];
  auVar2[5] = SVar10.v[2];
  auVar2[4] = SVar10.v[2];
  auVar2[3] = SVar10.v[1];
  auVar2[2] = SVar10.v[1];
  auVar2[0] = SVar10.v[0];
  auVar2[1] = auVar2[0];
  value.v = (short  [8])psraw(auVar2,8);
  Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}